

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

Compressor * Imf_2_5::newCompressor(Compression c,size_t maxScanLineSize,Header *hdr)

{
  size_t in_RSI;
  int in_EDI;
  DwaCompressor *unaff_retaddr;
  size_t in_stack_00000048;
  size_t in_stack_00000050;
  Header *in_stack_00000058;
  PizCompressor *in_stack_00000060;
  bool in_stack_00000097;
  size_t in_stack_00000098;
  size_t in_stack_000000a0;
  Header *in_stack_000000a8;
  B44Compressor *in_stack_000000b0;
  size_t in_stack_ffffffffffffffa0;
  Header *in_stack_ffffffffffffffa8;
  RleCompressor *in_stack_ffffffffffffffb0;
  Header *in_stack_ffffffffffffffb8;
  ZipCompressor *in_stack_ffffffffffffffc0;
  int in_stack_fffffffffffffff0;
  Header *in_stack_fffffffffffffff8;
  Header *hdr_00;
  
  switch(in_EDI) {
  case 1:
    hdr_00 = (Header *)operator_new(0x28);
    RleCompressor::RleCompressor
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    break;
  case 2:
    hdr_00 = (Header *)operator_new(0x30);
    ZipCompressor::ZipCompressor
              (in_stack_ffffffffffffffc0,hdr_00,(size_t)in_stack_ffffffffffffffb0,
               (size_t)in_stack_ffffffffffffffa8);
    break;
  case 3:
    hdr_00 = (Header *)operator_new(0x30);
    ZipCompressor::ZipCompressor
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)hdr_00,
               (size_t)in_stack_ffffffffffffffa8);
    break;
  case 4:
    hdr_00 = (Header *)operator_new(0x58);
    PizCompressor::PizCompressor
              (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
    break;
  case 5:
    hdr_00 = (Header *)operator_new(0x40);
    Pxr24Compressor::Pxr24Compressor
              ((Pxr24Compressor *)unaff_retaddr,in_stack_fffffffffffffff8,
               CONCAT44(in_EDI,in_stack_fffffffffffffff0),in_RSI);
    break;
  case 6:
    hdr_00 = (Header *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000097);
    break;
  case 7:
    hdr_00 = (Header *)operator_new(0x58);
    B44Compressor::B44Compressor
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
               in_stack_00000097);
    break;
  case 8:
    hdr_00 = (Header *)operator_new(0x128);
    DwaCompressor::DwaCompressor
              (unaff_retaddr,in_stack_fffffffffffffff8,in_EDI,in_stack_fffffffffffffff0,
               (AcCompression)(in_RSI >> 0x20));
    break;
  case 9:
    hdr_00 = (Header *)operator_new(0x128);
    DwaCompressor::DwaCompressor
              (unaff_retaddr,in_stack_fffffffffffffff8,in_EDI,in_stack_fffffffffffffff0,
               (AcCompression)(in_RSI >> 0x20));
    break;
  default:
    hdr_00 = (Header *)0x0;
  }
  return (Compressor *)hdr_00;
}

Assistant:

Compressor *
newCompressor (Compression c, size_t maxScanLineSize, const Header &hdr)
{
    switch (c)
    {
      case RLE_COMPRESSION:

	return new RleCompressor (hdr, maxScanLineSize);

      case ZIPS_COMPRESSION:

	return new ZipCompressor (hdr, maxScanLineSize, 1);

      case ZIP_COMPRESSION:

	return new ZipCompressor (hdr, maxScanLineSize, 16);

      case PIZ_COMPRESSION:

	return new PizCompressor (hdr, maxScanLineSize, 32);

      case PXR24_COMPRESSION:

	return new Pxr24Compressor (hdr, maxScanLineSize, 16);

      case B44_COMPRESSION:

	return new B44Compressor (hdr, maxScanLineSize, 32, false);

      case B44A_COMPRESSION:

	return new B44Compressor (hdr, maxScanLineSize, 32, true);

      case DWAA_COMPRESSION:

	return new DwaCompressor (hdr, maxScanLineSize, 32, 
                               DwaCompressor::STATIC_HUFFMAN);

      case DWAB_COMPRESSION:

	return new DwaCompressor (hdr, maxScanLineSize, 256, 
                               DwaCompressor::STATIC_HUFFMAN);

      default:

	return 0;
    }
}